

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall ON_SHA1::AccumulateInteger32Array(ON_SHA1 *this,size_t count,ON__INT32 *a)

{
  ON__INT32 local_2c;
  ON__INT32 *pOStack_28;
  ON__INT32 i;
  ON__INT32 *a1;
  ON__INT32 *a_local;
  size_t count_local;
  ON_SHA1 *this_local;
  
  if ((count != 0) && (a != (ON__INT32 *)0x0)) {
    pOStack_28 = a + count;
    a1 = a;
    a_local = (ON__INT32 *)count;
    count_local = (size_t)this;
    while (a1 < pOStack_28) {
      local_2c = *a1;
      a1 = a1 + 1;
      Internal_SwapBigEndianUpdate(this,&local_2c,4);
    }
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateInteger32Array(size_t count, const ON__INT32* a)
{
  if (count > 0 && nullptr != a)
  {
    const ON__INT32* a1 = a + count;
    ON__INT32 i;
    while (a < a1)
    {
      i = *a++;
      Internal_SwapBigEndianUpdate(&i, sizeof(i));
    }
  }
}